

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-messages.c
# Opt level: O0

void borg_parse(char *msg)

{
  char *what;
  size_t sVar1;
  int local_18;
  int local_14;
  int j;
  int i;
  char *msg_local;
  
  if ((*borg_cfg != 0) && (msg != (char *)0x0)) {
    what = format("# Parsing msg <%s>",msg);
    borg_note(what);
  }
  if ((borg_parse::len != 0) && ((msg == (char *)0x0 || (*msg != ' ')))) {
    local_18 = 0;
    for (local_14 = 0; local_14 < borg_parse::len + -1; local_14 = local_14 + 1) {
      if (((((borg_parse::buf[local_14] == '.') || (borg_parse::buf[local_14] == '!')) ||
           (borg_parse::buf[local_14] == '?')) || (borg_parse::buf[local_14] == '\"')) &&
         (borg_parse::buf[local_14 + 1] == ' ')) {
        borg_parse::buf[local_14 + 1] = '\0';
        borg_parse_aux(borg_parse::buf + local_18,(local_14 + 1) - local_18);
        borg_parse::buf[local_14 + 1] = ' ';
        for (local_18 = local_14 + 2; borg_parse::buf[local_18] == ' '; local_18 = local_18 + 1) {
        }
      }
    }
    borg_parse_aux(borg_parse::buf + local_18,borg_parse::len - local_18);
    borg_parse::len = 0;
  }
  if (msg == (char *)0x0) {
    borg_parse::len = 0;
  }
  else if (*msg == ' ') {
    sVar1 = strnfmt(borg_parse::buf + borg_parse::len,(long)(0x400 - borg_parse::len),"%s",msg);
    borg_parse::len = borg_parse::len + (int)sVar1;
  }
  else {
    sVar1 = strnfmt(borg_parse::buf,0x400,"%s",msg);
    borg_parse::len = (int)sVar1;
  }
  return;
}

Assistant:

void borg_parse(char *msg)
{
    static int  len = 0;
    static char buf[1024];

    /* Note the long message */
    if (borg_cfg[BORG_VERBOSE] && msg)
        borg_note(format("# Parsing msg <%s>", msg));

    /* Flush messages */
    if (len && (!msg || (msg[0] != ' '))) {
        int i, j;

        /* Split out punctuation */
        for (j = i = 0; i < len - 1; i++) {
            /* Check for punctuation */
            if ((buf[i] == '.') || (buf[i] == '!') || (buf[i] == '?')
                || (buf[i] == '"')) {
                /* Require space */
                if (buf[i + 1] == ' ') {
                    /* Terminate */
                    buf[i + 1] = '\0';

                    /* Parse fragment */
                    borg_parse_aux(buf + j, (i + 1) - j);

                    /* Restore */
                    buf[i + 1] = ' ';

                    /* Advance past spaces */
                    for (j = i + 2; buf[j] == ' '; j++) /* loop */
                        ;
                }
            }
        }

        /* Parse tail */
        borg_parse_aux(buf + j, len - j);

        /* Forget */
        len = 0;
    }

    /* No message */
    if (!msg) {
        /* Start over */
        len = 0;
    }

    /* Continued message */
    else if (msg[0] == ' ') {
        /* Collect, verify, and grow */
        len += strnfmt(buf + len, 1024 - len, "%s", msg);
    }

    /* New message */
    else {
        /* Collect, verify, and grow */
        len = strnfmt(buf, 1024, "%s", msg);
    }
}